

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScenePrivate::leaveModal(QGraphicsScenePrivate *this,QGraphicsItem *panel)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  QGraphicsItem **item;
  QGraphicsItem **ppQVar5;
  long in_FS_OFFSET;
  QSet<QGraphicsItem_*> local_78;
  undefined1 *puStack_70;
  QArrayDataPointer<QGraphicsItem_*> local_68;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_48;
  QGraphicsItem *panel_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->field_0x8;
  local_48.d = (Data *)0x0;
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  plVar1 = *(long **)(*(long *)(lVar3 + 8) + 0x88);
  panel_local = panel;
  (**(code **)(*plVar1 + 0x60))(&local_68,plVar1,1);
  ppQVar5 = local_68.ptr;
  for (lVar4 = local_68.size << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
    bVar2 = QGraphicsItem::isPanel(*ppQVar5);
    if (bVar2) {
      bVar2 = QGraphicsItem::isBlockedByModalPanel(*ppQVar5,(QGraphicsItem **)0x0);
      if (bVar2) {
        QSet<QGraphicsItem_*>::insert(&local_78,(QGraphicsItem **)&local_48);
      }
    }
    ppQVar5 = ppQVar5 + 1;
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_68);
  QtPrivate::sequential_erase_with_copy<QList<QGraphicsItem*>,QGraphicsItem*>
            (&this->modalPanels,&panel_local);
  local_78.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_78,WindowUnblocked);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  plVar1 = *(long **)(*(long *)(lVar3 + 8) + 0x88);
  (**(code **)(*plVar1 + 0x60))(&local_68,plVar1,1);
  ppQVar5 = local_68.ptr;
  for (lVar3 = local_68.size << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
    bVar2 = QGraphicsItem::isPanel(*ppQVar5);
    if (bVar2) {
      bVar2 = QHash<QGraphicsItem_*,_QHashDummyValue>::contains(&local_48,ppQVar5);
      if (bVar2) {
        bVar2 = QGraphicsItem::isBlockedByModalPanel(*ppQVar5,(QGraphicsItem **)0x0);
        if (!bVar2) {
          sendEvent(this,*ppQVar5,(QEvent *)&local_78);
        }
      }
    }
    ppQVar5 = ppQVar5 + 1;
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_68);
  QEvent::~QEvent((QEvent *)&local_78);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)&local_68,None);
  QGraphicsSceneHoverEvent::setScenePos
            ((QGraphicsSceneHoverEvent *)&local_68,&this->lastSceneMousePos);
  dispatchHoverEvent(this,(QGraphicsSceneHoverEvent *)&local_68);
  QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_68);
  QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::leaveModal(QGraphicsItem *panel)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(panel && panel->isPanel());

    QSet<QGraphicsItem *> blockedPanels;
    {
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && item->isBlockedByModalPanel())
                blockedPanels.insert(item);
        }
    }

    modalPanels.removeAll(panel);

    {
        QEvent e(QEvent::WindowUnblocked);
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && blockedPanels.contains(item) && !item->isBlockedByModalPanel())
                sendEvent(item, &e);
        }
    }

    // send GraphicsSceneHoverEnter events to newly unblocked items
    QGraphicsSceneHoverEvent hoverEvent;
    hoverEvent.setScenePos(lastSceneMousePos);
    dispatchHoverEvent(&hoverEvent);
}